

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledPixel.cxx
# Opt level: O3

void __thiscall SSD1306::OledPixel::pixel(OledPixel *this,OledPoint p,PixelStyle style)

{
  if (style < None) {
    (*this->_vptr_OledPixel[(ulong)style + 5])();
    return;
  }
  return;
}

Assistant:

void
SSD1306::OledPixel::pixel(
    SSD1306::OledPoint p,
    SSD1306::PixelStyle style)
{
    switch (style)
    {
    case PixelStyle::Set:

        setPixel(p);
        break;

    case PixelStyle::Unset:

        unsetPixel(p);
        break;

    case PixelStyle::Xor:

        xorPixel(p);
        break;

    case PixelStyle::None:

        break;
    }
}